

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O0

RK_S32 check_sthd(char *name,MppSThdImpl *thd)

{
  MppSThdImpl *thd_local;
  char *name_local;
  
  if (thd == (MppSThdImpl *)0x0) {
    _mpp_log_l(2,"mpp_thread","MppSThd NULL found at %s\n",(char *)0x0,name);
    name_local._4_4_ = -1;
  }
  else if ((MppSThdImpl *)(thd->ctx).thd == thd) {
    name_local._4_4_ = 0;
  }
  else {
    _mpp_log_l(2,"mpp_thread","MppSThd check %p:%p mismatch at %s\n",(char *)0x0,(thd->ctx).thd,thd,
               name);
    name_local._4_4_ = -1;
  }
  return name_local._4_4_;
}

Assistant:

static RK_S32 check_sthd(const char *name, MppSThdImpl *thd)
{
    if (!thd) {
        mpp_err("MppSThd NULL found at %s\n", name);
        return MPP_NOK;
    }

    if (thd->ctx.thd != thd) {
        mpp_err("MppSThd check %p:%p mismatch at %s\n", thd->ctx.thd, thd, name);
        return MPP_NOK;
    }

    return MPP_OK;
}